

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

void __thiscall depspawn::internal::arg_info::insert_in_arglist(arg_info *this,arg_info **args)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  arg_info *paVar4;
  bool bVar5;
  arg_info *paStack_8;
  
  paStack_8 = *args;
  if (paStack_8 != (arg_info *)0x0) {
    uVar1 = this->addr;
    uVar2 = paStack_8->addr;
    if (uVar2 <= uVar1) {
      paVar4 = paStack_8->next;
      while( true ) {
        if (paVar4 == (arg_info *)0x0) {
          if ((this->rank == '\0') && (uVar1 == uVar2)) {
            solve_overlap(this,paStack_8);
            return;
          }
          paStack_8->next = this;
          return;
        }
        uVar2 = paVar4->addr;
        if (uVar1 < uVar2) break;
        paStack_8 = paVar4;
        paVar4 = paVar4->next;
      }
      if ((this->rank == '\0') && (uVar1 == paStack_8->addr)) {
        bVar5 = this->wr;
        bVar3 = true;
        if (bVar5 == false) {
          bVar3 = paStack_8->wr;
        }
        uVar1 = this->size;
        uVar2 = paStack_8->size;
        if (uVar1 - uVar2 == 0) {
          paStack_8->wr = bVar3;
          paVar4 = (arg_info *)Pool._32_8_;
          do {
            this->next = paVar4;
            LOCK();
            bVar5 = paVar4 != (arg_info *)Pool._32_8_;
            uVar1 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
            if (bVar5) {
              paVar4 = (arg_info *)Pool._32_8_;
              uVar1 = Pool._32_8_;
            }
            Pool._32_8_ = uVar1;
            UNLOCK();
          } while (bVar5);
        }
        else {
          if (uVar1 < uVar2) {
            bVar5 = paStack_8->wr;
            paVar4 = (arg_info *)Pool._32_8_;
            if (bVar3 == bVar5) {
              do {
                this->next = paVar4;
                LOCK();
                bVar5 = paVar4 != (arg_info *)Pool._32_8_;
                uVar1 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
                if (bVar5) {
                  paVar4 = (arg_info *)Pool._32_8_;
                  uVar1 = Pool._32_8_;
                }
                Pool._32_8_ = uVar1;
                UNLOCK();
              } while (bVar5);
              return;
            }
            this->addr = this->addr + uVar1;
            this->size = uVar2 - uVar1;
            this->wr = bVar5;
            paStack_8->size = uVar1;
            paStack_8->wr = bVar3;
          }
          else {
            if (bVar5 == bVar3) {
              paStack_8->wr = bVar5;
              paStack_8->size = uVar1;
              paVar4 = (arg_info *)Pool._32_8_;
              do {
                this->next = paVar4;
                LOCK();
                bVar5 = paVar4 != (arg_info *)Pool._32_8_;
                uVar1 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
                if (bVar5) {
                  paVar4 = (arg_info *)Pool._32_8_;
                  uVar1 = Pool._32_8_;
                }
                Pool._32_8_ = uVar1;
                UNLOCK();
              } while (bVar5);
              return;
            }
            this->addr = this->addr + uVar2;
            this->size = uVar1 - uVar2;
          }
          insert_in_arglist(this,&paStack_8);
        }
        return;
      }
      paStack_8->next = this;
      this->next = paVar4;
      return;
    }
    this->next = paStack_8;
  }
  *args = this;
  return;
}

Assistant:

void arg_info::insert_in_arglist(arg_info*& args)
    { arg_info *p, *prev;
      
      if(!args) {
	args = this;
      } else if(addr < args->addr) {
	next = args;
	args = this;
      } else {
	
	prev = args;
	p = args->next;
	while(p) {
	  if(addr < p->addr) {
	    if( !is_array() && (addr == prev->addr) ) //Arrays are inserted replicated
	      solve_overlap(prev);
	    else {
	      prev->next = this;
	      next = p;
	    }
	    break;
	  }
	  prev = p;
	  p = p->next;
	}
	
        if(!p) {
          if( !is_array() && (addr == prev->addr) ) { //Arrays are inserted replicated
	    solve_overlap(prev);
          } else {
	    prev->next = this;
          }
        }
      }
      
    }